

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

ExpEmit __thiscall FxClassTypeCast::Emit(FxClassTypeCast *this,VMFunctionBuilder *build)

{
  FxExpression *pFVar1;
  _func_int **ptr;
  PClass *pPVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  undefined8 in_RAX;
  uint extraout_var;
  PSymbol *pPVar7;
  undefined4 extraout_var_00;
  PClass *pPVar8;
  ulong uVar9;
  bool bVar10;
  undefined8 local_38;
  
  local_38._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
  pFVar1 = this->basex;
  if (pFVar1->ValueType == (PType *)TypeName) {
    uVar4 = (*pFVar1->_vptr_FxExpression[9])(pFVar1,build);
    if ((extraout_var & 1) != 0) {
      __assert_fail("!clsname.Konst",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                    ,0x2568,"virtual ExpEmit FxClassTypeCast::Emit(VMFunctionBuilder *)");
    }
    uVar3 = VMFunctionBuilder::RegAvailability::Get(build->Registers + 3,1);
    local_38 = CONCAT44(local_38._4_4_,uVar4) & 0xffffffff0000ffff;
    VMFunctionBuilder::Emit(build,0x46,0,uVar4 >> 0x10 & 0xff,uVar4 & 0xffff);
    uVar5 = VMFunctionBuilder::GetConstantAddress(build,this->desttype,'\x01');
    VMFunctionBuilder::Emit(build,0x46,0,7,uVar5);
    local_38 = CONCAT44(0x242,(int)local_38);
    pPVar7 = FindBuiltinFunction((FName *)((long)&local_38 + 4),BuiltinNameToClass);
    pPVar2 = PSymbolVMFunction::RegistrationInfo.MyClass;
    if ((pPVar7->super_PTypeBase).super_DObject.Class == (PClass *)0x0) {
      iVar6 = (**(pPVar7->super_PTypeBase).super_DObject._vptr_DObject)(pPVar7);
      (pPVar7->super_PTypeBase).super_DObject.Class = (PClass *)CONCAT44(extraout_var_00,iVar6);
    }
    pPVar8 = (pPVar7->super_PTypeBase).super_DObject.Class;
    bVar10 = pPVar8 != (PClass *)0x0;
    if (pPVar8 != pPVar2 && bVar10) {
      do {
        pPVar8 = pPVar8->ParentClass;
        bVar10 = pPVar8 != (PClass *)0x0;
        if (pPVar8 == pPVar2) break;
      } while (pPVar8 != (PClass *)0x0);
    }
    if (!bVar10) {
      __assert_fail("sym->IsKindOf(RUNTIME_CLASS(PSymbolVMFunction))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                    ,0x2571,"virtual ExpEmit FxClassTypeCast::Emit(VMFunctionBuilder *)");
    }
    ptr = pPVar7[1].super_PTypeBase.super_DObject._vptr_DObject;
    if (ptr == (_func_int **)0x0) {
      __assert_fail("((PSymbolVMFunction *)sym)->Function != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                    ,0x2572,"virtual ExpEmit FxClassTypeCast::Emit(VMFunctionBuilder *)");
    }
    uVar5 = VMFunctionBuilder::GetConstantAddress(build,ptr,'\x01');
    VMFunctionBuilder::Emit(build,0x49,uVar5,2,1);
    VMFunctionBuilder::Emit(build,0x4d,0,3,uVar3 & 0xffff);
    uVar9 = 0x1030000;
    if ((CONCAT44(extraout_var,uVar4) & 0x10000fc0000) == 0) {
      VMFunctionBuilder::RegAvailability::Return
                (build->Registers + ((uint)(CONCAT44(extraout_var,uVar4) >> 0x10) & 3),(int)local_38
                 ,uVar4 >> 0x18);
    }
  }
  else {
    uVar3 = VMFunctionBuilder::GetConstantAddress(build,(void *)0x0,'\x01');
    uVar9 = 0x101030000;
  }
  return (ExpEmit)(uVar3 & 0xffff | uVar9);
}

Assistant:

ExpEmit FxClassTypeCast::Emit(VMFunctionBuilder *build)
{
	if (basex->ValueType != TypeName)
	{
		return ExpEmit(build->GetConstantAddress(nullptr, ATAG_OBJECT), REGT_POINTER, true);
	}
	ExpEmit clsname = basex->Emit(build);
	assert(!clsname.Konst);
	ExpEmit dest(build, REGT_POINTER);
	build->Emit(OP_PARAM, 0, clsname.RegType, clsname.RegNum);
	build->Emit(OP_PARAM, 0, REGT_POINTER | REGT_KONST, build->GetConstantAddress(const_cast<PClass *>(desttype), ATAG_OBJECT));

	// Call the BuiltinNameToClass function to convert from 'name' to class.
	VMFunction *callfunc;
	PSymbol *sym = FindBuiltinFunction(NAME_BuiltinNameToClass, BuiltinNameToClass);

	assert(sym->IsKindOf(RUNTIME_CLASS(PSymbolVMFunction)));
	assert(((PSymbolVMFunction *)sym)->Function != nullptr);
	callfunc = ((PSymbolVMFunction *)sym)->Function;

	build->Emit(OP_CALL_K, build->GetConstantAddress(callfunc, ATAG_OBJECT), 2, 1);
	build->Emit(OP_RESULT, 0, REGT_POINTER, dest.RegNum);
	clsname.Free(build);
	return dest;
}